

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> __thiscall
flatbuffers::NewFBSCodeGenerator(flatbuffers *this,bool no_log)

{
  FBSCodeGenerator *this_00;
  unique_ptr<flatbuffers::(anonymous_namespace)::FBSCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::FBSCodeGenerator>_>
  local_20;
  byte local_11;
  flatbuffers *pfStack_10;
  bool no_log_local;
  
  local_11 = no_log;
  pfStack_10 = this;
  this_00 = (FBSCodeGenerator *)operator_new(0x30);
  anon_unknown_0::FBSCodeGenerator::FBSCodeGenerator(this_00,(bool)(local_11 & 1));
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::FBSCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::FBSCodeGenerator>>
  ::unique_ptr<std::default_delete<flatbuffers::(anonymous_namespace)::FBSCodeGenerator>,void>
            ((unique_ptr<flatbuffers::(anonymous_namespace)::FBSCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::FBSCodeGenerator>>
              *)&local_20,this_00);
  std::unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>::
  unique_ptr<flatbuffers::(anonymous_namespace)::FBSCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::FBSCodeGenerator>,void>
            ((unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>
              *)this,&local_20);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::FBSCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::FBSCodeGenerator>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CodeGenerator> NewFBSCodeGenerator(const bool no_log) {
  return std::unique_ptr<FBSCodeGenerator>(new FBSCodeGenerator(no_log));
}